

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm)

{
  bool bVar1;
  bool bVar2;
  HandlerResponse HVar3;
  Handlers *handlers;
  ContentReader *this_00;
  ContentReader reader;
  ContentReader local_1f0;
  Reader local_1b0;
  MultipartReader local_190;
  ContentReader local_170;
  ContentReader local_130;
  ContentReader local_f0;
  ContentReader local_b0;
  anon_class_32_4_58ec1421 local_70;
  anon_class_32_4_58ec1421 local_50;
  
  if (((this->pre_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (HVar3 = std::
              function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
              ::operator()(&this->pre_routing_handler_,req,res), HVar3 == Handled)) {
    return true;
  }
  bVar1 = std::operator==(&req->method,"HEAD");
  bVar2 = std::operator==(&req->method,"GET");
  if (((bVar1) || (bVar2)) && (bVar1 = handle_file_request(this,req,res,bVar1), bVar1)) {
    return true;
  }
  bVar1 = detail::expect_content(req);
  if (!bVar1) goto LAB_0014d3cf;
  local_50.this = this;
  local_50.strm = strm;
  local_50.req = req;
  local_50.res = res;
  std::function<bool(std::function<bool(char_const*,unsigned_long)>)>::
  function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&)::_lambda(std::function<bool(char_const*,unsigned_long)>)_1_,void>
            ((function<bool(std::function<bool(char_const*,unsigned_long)>)> *)&local_1b0,&local_50)
  ;
  local_70.this = this;
  local_70.strm = strm;
  local_70.req = req;
  local_70.res = res;
  std::
  function<bool(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)>
  ::
  function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&)::_lambda(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)_1_,void>
            ((function<bool(std::function<bool(httplib::MultipartFormData_const&)>,std::function<bool(char_const*,unsigned_long)>)>
              *)&local_190,&local_70);
  ContentReader::ContentReader(&local_1f0,&local_1b0,&local_190);
  std::_Function_base::~_Function_base(&local_190.super__Function_base);
  std::_Function_base::~_Function_base(&local_1b0.super__Function_base);
  bVar1 = std::operator==(&req->method,"POST");
  if (bVar1) {
    ContentReader::ContentReader(&local_b0,&local_1f0);
    bVar1 = dispatch_request_for_content_reader
                      (this,req,res,&local_b0,&this->post_handlers_for_content_reader_);
    this_00 = &local_b0;
LAB_0014d394:
    ContentReader::~ContentReader(this_00);
    if (bVar1 != false) {
      ContentReader::~ContentReader(&local_1f0);
      return true;
    }
  }
  else {
    bVar1 = std::operator==(&req->method,"PUT");
    if (bVar1) {
      ContentReader::ContentReader(&local_f0,&local_1f0);
      bVar1 = dispatch_request_for_content_reader
                        (this,req,res,&local_f0,&this->put_handlers_for_content_reader_);
      this_00 = &local_f0;
      goto LAB_0014d394;
    }
    bVar1 = std::operator==(&req->method,"PATCH");
    if (bVar1) {
      ContentReader::ContentReader(&local_130,&local_1f0);
      bVar1 = dispatch_request_for_content_reader
                        (this,req,res,&local_130,&this->patch_handlers_for_content_reader_);
      this_00 = &local_130;
      goto LAB_0014d394;
    }
    bVar1 = std::operator==(&req->method,"DELETE");
    if (bVar1) {
      ContentReader::ContentReader(&local_170,&local_1f0);
      bVar1 = dispatch_request_for_content_reader
                        (this,req,res,&local_170,&this->delete_handlers_for_content_reader_);
      this_00 = &local_170;
      goto LAB_0014d394;
    }
  }
  ContentReader::~ContentReader(&local_1f0);
  bVar1 = read_content(this,strm,req,res);
  if (!bVar1) {
    return false;
  }
LAB_0014d3cf:
  bVar1 = std::operator==(&req->method,"GET");
  if ((bVar1) || (bVar1 = std::operator==(&req->method,"HEAD"), bVar1)) {
    handlers = &this->get_handlers_;
  }
  else {
    bVar1 = std::operator==(&req->method,"POST");
    if (bVar1) {
      handlers = &this->post_handlers_;
    }
    else {
      bVar1 = std::operator==(&req->method,"PUT");
      if (bVar1) {
        handlers = &this->put_handlers_;
      }
      else {
        bVar1 = std::operator==(&req->method,"DELETE");
        if (bVar1) {
          handlers = &this->delete_handlers_;
        }
        else {
          bVar1 = std::operator==(&req->method,"OPTIONS");
          if (bVar1) {
            handlers = &this->options_handlers_;
          }
          else {
            bVar1 = std::operator==(&req->method,"PATCH");
            if (!bVar1) {
              res->status = 400;
              return false;
            }
            handlers = &this->patch_handlers_;
          }
        }
      }
    }
  }
  bVar1 = dispatch_request(this,req,res,handlers);
  return bVar1;
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm) {
  if (pre_routing_handler_ &&
      pre_routing_handler_(req, res) == HandlerResponse::Handled) {
    return true;
  }

  // File handler
  bool is_head_request = req.method == "HEAD";
  if ((req.method == "GET" || is_head_request) &&
      handle_file_request(req, res, is_head_request)) {
    return true;
  }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
          [&](ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, req, res, std::move(receiver), nullptr, nullptr);
          },
          [&](MultipartContentHeader header, ContentReceiver receiver) {
            return read_content_with_content_receiver(strm, req, res, nullptr,
                                                      std::move(header),
                                                      std::move(receiver));
          });

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                patch_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "DELETE") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                delete_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}